

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

int16_t WebRtcIsac_EncodeJitterInfo(int32_t jitterIndex,Bitstr *streamData)

{
  int16_t iVar1;
  int intVar;
  
  iVar1 = -1;
  if ((uint)jitterIndex < 2) {
    WebRtcIsac_EncHistMulti(streamData,&intVar,kOneBitEqualProbCdf_ptr,1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int16_t WebRtcIsac_EncodeJitterInfo(int32_t jitterIndex,
                                    Bitstr* streamData) {
  /* This is to avoid LINUX warning until we change 'int' to 'Word32'. */
  int intVar;

  if ((jitterIndex < 0) || (jitterIndex > 1)) {
    return -1;
  }
  intVar = (int)(jitterIndex);
  /* Use the same CDF table as for bandwidth
   * both take two values with equal probability.*/
  WebRtcIsac_EncHistMulti(streamData, &intVar, kOneBitEqualProbCdf_ptr, 1);
  return 0;
}